

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O2

void __thiscall VCFilter::VCFilter(VCFilter *this)

{
  (this->Guid).d.d = (Data *)0x0;
  (this->Guid).d.ptr = (char16_t *)0x0;
  (this->Filter).d.ptr = (char16_t *)0x0;
  (this->Filter).d.size = 0;
  (this->Name).d.size = 0;
  (this->Filter).d.d = (Data *)0x0;
  (this->Guid).d.size = 0;
  (this->Name).d.d = (Data *)0x0;
  (this->Name).d.ptr = (char16_t *)0x0;
  this->ParseFiles = unset;
  this->Config = (VCConfiguration *)0x0;
  (this->Files).d.d = (Data *)0x0;
  (this->Files).d.ptr = (VCFilterFile *)0x0;
  (this->Files).d.size = 0;
  VCCustomBuildTool::VCCustomBuildTool(&this->CustomBuildTool);
  VCCLCompilerTool::VCCLCompilerTool(&this->CompilerTool);
  this->useCustomBuildTool = false;
  this->useCompilerTool = false;
  return;
}

Assistant:

VCFilter::VCFilter()
    :   ParseFiles(unset),
        Config(nullptr)
{
    useCustomBuildTool = false;
    useCompilerTool = false;
}